

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int xpathDocTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  glob_t globbuf;
  char pattern [500];
  char result [500];
  glob64_t local_460;
  char local_418 [499];
  undefined1 local_225;
  char local_218 [499];
  undefined1 local_25;
  
  xpathDocument = (xmlDocPtr)xmlReadFile(filename,0,options | 10);
  if (xpathDocument == (xmlDocPtr)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
    iVar3 = -1;
  }
  else {
    pcVar2 = baseFilename(filename);
    iVar3 = 0;
    iVar1 = snprintf(local_418,499,"./test/XPath/tests/%s*",pcVar2);
    if (0x1f2 < iVar1) {
      local_225 = 0;
    }
    local_460.gl_offs = 0;
    glob64(local_418,8,(__errfunc *)0x0,&local_460);
    if (local_460.gl_pathc != 0) {
      iVar3 = 0;
      uVar4 = 0;
      do {
        baseFilename(local_460.gl_pathv[uVar4]);
        iVar1 = snprintf(local_218,499,"result/XPath/tests/%s");
        if (0x1f2 < iVar1) {
          local_25 = 0;
        }
        iVar1 = xpathCommonTest(local_460.gl_pathv[uVar4],local_218,0,0);
        if (iVar1 != 0) {
          iVar3 = iVar1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_460.gl_pathc);
    }
    globfree64(&local_460);
    xmlFreeDoc(xpathDocument);
  }
  return iVar3;
}

Assistant:

static int
xpathDocTest(const char *filename,
             const char *resul ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
             int options) {

    char pattern[500];
    char result[500];
    glob_t globbuf;
    size_t i;
    int ret = 0, res;

    xpathDocument = xmlReadFile(filename, NULL,
                                options | XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (xpathDocument == NULL) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    res = snprintf(pattern, 499, "./test/XPath/tests/%s*",
            baseFilename(filename));
    if (res >= 499)
        pattern[499] = 0;
    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        res = snprintf(result, 499, "result/XPath/tests/%s",
	         baseFilename(globbuf.gl_pathv[i]));
        if (res >= 499)
            result[499] = 0;
	res = xpathCommonTest(globbuf.gl_pathv[i], &result[0], 0, 0);
	if (res != 0)
	    ret = res;
    }
    globfree(&globbuf);

    xmlFreeDoc(xpathDocument);
    return(ret);
}